

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageColorReplace(Image *image,Color color,Color replace)

{
  Image image_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Color *pCVar5;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int newFormat;
  int local_28;
  int format;
  int x;
  int y;
  Color *pixels;
  Image *image_local;
  Color replace_local;
  Color color_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    uVar1 = image->width;
    uVar2 = image->height;
    uVar3 = image->mipmaps;
    uVar4 = image->format;
    image_00.height = uVar4;
    image_00.width = uVar3;
    image_00.data._4_4_ = uVar2;
    image_00.data._0_4_ = uVar1;
    image_00.mipmaps = in_stack_ffffffffffffffd0;
    image_00.format = in_stack_ffffffffffffffd4;
    pCVar5 = LoadImageColors(image_00);
    for (format = 0; format < image->height; format = format + 1) {
      for (local_28 = 0; local_28 < image->width; local_28 = local_28 + 1) {
        image_local._4_1_ = color.r;
        if (((pCVar5[format * image->width + local_28].r == image_local._4_1_) &&
            (image_local._5_1_ = color.g,
            pCVar5[format * image->width + local_28].g == image_local._5_1_)) &&
           ((image_local._6_1_ = color.b,
            pCVar5[format * image->width + local_28].b == image_local._6_1_ &&
            (image_local._7_1_ = color.a,
            pCVar5[format * image->width + local_28].a == image_local._7_1_)))) {
          image_local._0_1_ = replace.r;
          pCVar5[format * image->width + local_28].r = (uchar)image_local;
          image_local._1_1_ = replace.g;
          pCVar5[format * image->width + local_28].g = image_local._1_1_;
          image_local._2_1_ = replace.b;
          pCVar5[format * image->width + local_28].b = image_local._2_1_;
          image_local._3_1_ = replace.a;
          pCVar5[format * image->width + local_28].a = image_local._3_1_;
        }
      }
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar5;
    image->format = 7;
    ImageFormat(image,newFormat);
  }
  return;
}

Assistant:

void ImageColorReplace(Image *image, Color color, Color replace)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            if ((pixels[y*image->width + x].r == color.r) &&
                (pixels[y*image->width + x].g == color.g) &&
                (pixels[y*image->width + x].b == color.b) &&
                (pixels[y*image->width + x].a == color.a))
            {
                pixels[y*image->width + x].r = replace.r;
                pixels[y*image->width + x].g = replace.g;
                pixels[y*image->width + x].b = replace.b;
                pixels[y*image->width + x].a = replace.a;
            }
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}